

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAnalyticSolution.cpp
# Opt level: O0

FADFADSTATE * FADatan(FADFADSTATE *x)

{
  int iVar1;
  Fad<double> *pFVar2;
  Fad<Fad<double>_> *in_RSI;
  FADFADSTATE *in_RDI;
  int i;
  int sz;
  Fad<double> fadres;
  FADFADSTATE *resa;
  int in_stack_fffffffffffffecc;
  Fad<Fad<double>_> *in_stack_fffffffffffffed0;
  int i_00;
  undefined4 in_stack_fffffffffffffee8;
  int iVar3;
  Fad<double> *x_00;
  FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
  *in_stack_ffffffffffffff10;
  FadExpr<FadFuncAtan<Fad<double>_>_> *in_stack_ffffffffffffff18;
  Fad<double> *in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff2c;
  Fad<Fad<double>_> *in_stack_ffffffffffffff30;
  int local_70;
  Fad<double> local_58 [2];
  
  Fad<Fad<double>_>::val(in_RSI);
  x_00 = local_58;
  atan<double>(x_00);
  Fad<double>::Fad<FadFuncAtan<Fad<double>>>(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  FadExpr<FadFuncAtan<Fad<double>_>_>::~FadExpr
            ((FadExpr<FadFuncAtan<Fad<double>_>_> *)in_stack_fffffffffffffed0);
  iVar1 = Fad<Fad<double>_>::size((Fad<Fad<double>_> *)0x1e61cd6);
  iVar3 = iVar1;
  Fad<Fad<double>_>::Fad
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,in_stack_ffffffffffffff20);
  for (local_70 = 0; local_70 < iVar1; local_70 = local_70 + 1) {
    pFVar2 = Fad<Fad<double>_>::val(in_RSI);
    i_00 = (int)((ulong)pFVar2 >> 0x20);
    Fad<Fad<double>_>::val(in_RSI);
    operator*<Fad<double>,_Fad<double>,_nullptr>(x_00,(Fad<double> *)in_RDI);
    operator+<double,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_nullptr>
              ((double)in_stack_ffffffffffffff18,
               (FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffff10);
    operator/<double,_FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_nullptr>
              ((double)in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
    Fad<Fad<double>_>::dx((Fad<Fad<double>_> *)CONCAT44(iVar3,in_stack_fffffffffffffee8),i_00);
    operator*<FadExpr<FadBinaryDiv<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryDiv<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>
                *)x_00,(Fad<double> *)in_RDI);
    in_stack_fffffffffffffed0 =
         (Fad<Fad<double>_> *)
         Fad<Fad<double>_>::fastAccessDx(in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
    Fad<double>::operator=
              ((Fad<double> *)in_RSI,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryDiv<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_Fad<double>_>_>
                *)CONCAT44(iVar3,in_stack_fffffffffffffee8));
    FadExpr<FadBinaryMul<FadExpr<FadBinaryDiv<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_Fad<double>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryDiv<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_Fad<double>_>_>
                *)in_stack_fffffffffffffed0);
    Fad<double>::~Fad((Fad<double> *)in_stack_fffffffffffffed0);
    FadExpr<FadBinaryDiv<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryDiv<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_fffffffffffffed0);
    FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>::
    ~FadExpr((FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
              *)in_stack_fffffffffffffed0);
    FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffffed0);
  }
  Fad<double>::~Fad((Fad<double> *)in_stack_fffffffffffffed0);
  return in_RDI;
}

Assistant:

static FADFADSTATE FADatan(FADFADSTATE x)
{
    Fad<STATE> fadres = atan(x.val());
    int sz = x.size();
    FADFADSTATE resa(sz,fadres);
    for (int i=0; i<sz; i++) {
        resa.fastAccessDx(i) = 1./(1.+x.val()*x.val())*x.dx(i);
    }
    return resa;
}